

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O0

GridNode * __thiscall Grid::get_target_node(Grid *this)

{
  GridNode *pGVar1;
  int local_20;
  int local_1c;
  int x;
  int y;
  Grid *this_local;
  
  local_1c = 0;
  do {
    if (this->rows <= local_1c) {
      pGVar1 = get_node_from_position(this,0,0);
      return pGVar1;
    }
    for (local_20 = 0; local_20 < this->columns; local_20 = local_20 + 1) {
      pGVar1 = get_node_from_position(this,local_20,local_1c);
      if (pGVar1->state == TARGET) {
        pGVar1 = get_node_from_position(this,local_20,local_1c);
        return pGVar1;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

GridNode *get_target_node()
    {
        for (int y = 0; y < rows; y++)
        {
            for (int x = 0; x < columns; x++)
            {
                if (get_node_from_position(x, y)->state == TARGET)
                {
                    return get_node_from_position(x, y);
                }
            }
        }
        return get_node_from_position(0, 0);
    }